

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decoder.c
# Opt level: O2

ZyanStatus
ZydisInputNext(ZydisDecoderState *state,ZydisDecodedInstruction *instruction,ZyanU8 *value)

{
  ZyanU8 *pZVar1;
  ZyanStatus ZVar2;
  
  if (value == (ZyanU8 *)0x0) {
    __assert_fail("value",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                  ,0x131,
                  "ZyanStatus ZydisInputNext(ZydisDecoderState *, ZydisDecodedInstruction *, ZyanU8 *)"
                 );
  }
  ZVar2 = 0x80200002;
  if (instruction->length < 0xf) {
    if (state->buffer_len == 0) {
      return 0x80200000;
    }
    pZVar1 = state->buffer;
    state->buffer = pZVar1 + 1;
    *value = *pZVar1;
    instruction->length = instruction->length + '\x01';
    state->buffer_len = state->buffer_len - 1;
    ZVar2 = 0x100000;
  }
  return ZVar2;
}

Assistant:

static ZyanStatus ZydisInputNext(ZydisDecoderState* state,
    ZydisDecodedInstruction* instruction, ZyanU8* value)
{
    ZYAN_ASSERT(state);
    ZYAN_ASSERT(instruction);
    ZYAN_ASSERT(value);

    if (instruction->length >= ZYDIS_MAX_INSTRUCTION_LENGTH)
    {
        return ZYDIS_STATUS_INSTRUCTION_TOO_LONG;
    }

    if (state->buffer_len > 0)
    {
        *value = state->buffer++[0];
        ++instruction->length;
        --state->buffer_len;
        return ZYAN_STATUS_SUCCESS;
    }

    return ZYDIS_STATUS_NO_MORE_DATA;
}